

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O3

yyjson_doc * duckdb_yyjson::yyjson_mut_val_imut_copy(yyjson_mut_val *mval,yyjson_alc *alc)

{
  _func_void_ptr_void_ptr_size_t *p_Var1;
  _func_void_ptr_void_ptr_void_ptr_size_t_size_t *p_Var2;
  void *pvVar3;
  yyjson_doc *pyVar4;
  usize uVar5;
  undefined **ppuVar6;
  usize str_sum;
  char *str_hdr;
  usize val_num;
  usize local_38;
  char *local_30;
  yyjson_doc *local_28;
  usize local_20;
  
  local_30 = (char *)&local_38;
  local_20 = 0;
  local_38 = 0;
  if (mval == (yyjson_mut_val *)0x0) {
    return (yyjson_doc *)0x0;
  }
  ppuVar6 = &YYJSON_DEFAULT_ALC;
  if (alc != (yyjson_alc *)0x0) {
    ppuVar6 = &alc->malloc;
  }
  yyjson_mut_stat(mval,&local_20,&local_38);
  pyVar4 = (yyjson_doc *)
           (*((yyjson_alc *)ppuVar6)->malloc)(((yyjson_alc *)ppuVar6)->ctx,local_20 * 0x10 + 0x40);
  if (pyVar4 == (yyjson_doc *)0x0) {
LAB_0121f1b9:
    pyVar4 = (yyjson_doc *)0x0;
  }
  else {
    pyVar4->dat_read = 0;
    pyVar4->val_read = 0;
    (pyVar4->alc).free = (_func_void_void_ptr_void_ptr *)0x0;
    (pyVar4->alc).ctx = (void *)0x0;
    (pyVar4->alc).malloc = (_func_void_ptr_void_ptr_size_t *)0x0;
    (pyVar4->alc).realloc = (_func_void_ptr_void_ptr_void_ptr_size_t_size_t *)0x0;
    pyVar4->str_pool = (char *)0x0;
    local_28 = pyVar4 + 1;
    pyVar4->root = (yyjson_val *)local_28;
    p_Var1 = ((yyjson_alc *)ppuVar6)->malloc;
    p_Var2 = ((yyjson_alc *)ppuVar6)->realloc;
    pvVar3 = ((yyjson_alc *)ppuVar6)->ctx;
    (pyVar4->alc).free = ((yyjson_alc *)ppuVar6)->free;
    (pyVar4->alc).ctx = pvVar3;
    (pyVar4->alc).malloc = p_Var1;
    (pyVar4->alc).realloc = p_Var2;
    if (local_38 != 0) {
      local_30 = (char *)(*((yyjson_alc *)ppuVar6)->malloc)(((yyjson_alc *)ppuVar6)->ctx,local_38);
      pyVar4->str_pool = local_30;
      if (local_30 == (char *)0x0) {
        (*((yyjson_alc *)ppuVar6)->free)(((yyjson_alc *)ppuVar6)->ctx,pyVar4);
        goto LAB_0121f1b9;
      }
    }
    uVar5 = yyjson_imut_copy((yyjson_val **)&local_28,&local_30,mval);
    pyVar4->val_read = uVar5;
    pyVar4->dat_read = local_38 + 1;
  }
  return pyVar4;
}

Assistant:

yyjson_doc *yyjson_mut_val_imut_copy(yyjson_mut_val *mval,
                                     const yyjson_alc *alc) {
    usize val_num = 0, str_sum = 0, hdr_size, buf_size;
    yyjson_doc *doc = NULL;
    yyjson_val *val_hdr = NULL;

    /* This value should be NULL here. Setting a non-null value suppresses
       warning from the clang analyzer. */
    char *str_hdr = (char *)(void *)&str_sum;
    if (!mval) return NULL;
    if (!alc) alc = &YYJSON_DEFAULT_ALC;

    /* traverse the input value to get pool size */
    yyjson_mut_stat(mval, &val_num, &str_sum);

    /* create doc and val pool */
    hdr_size = size_align_up(sizeof(yyjson_doc), sizeof(yyjson_val));
    buf_size = hdr_size + val_num * sizeof(yyjson_val);
    doc = (yyjson_doc *)alc->malloc(alc->ctx, buf_size);
    if (!doc) return NULL;
    memset(doc, 0, sizeof(yyjson_doc));
    val_hdr = (yyjson_val *)(void *)((char *)(void *)doc + hdr_size);
    doc->root = val_hdr;
    doc->alc = *alc;

    /* create str pool */
    if (str_sum > 0) {
        str_hdr = (char *)alc->malloc(alc->ctx, str_sum);
        doc->str_pool = str_hdr;
        if (!str_hdr) {
            alc->free(alc->ctx, (void *)doc);
            return NULL;
        }
    }

    /* copy vals and strs */
    doc->val_read = yyjson_imut_copy(&val_hdr, &str_hdr, mval);
    doc->dat_read = str_sum + 1;
    return doc;
}